

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O0

bool __thiscall
SampleMuxerMetadata::Parse(SampleMuxerMetadata *this,char *file,Kind param_2,uint64_t track_num)

{
  bool bVar1;
  int iVar2;
  cue_t *c;
  Time t;
  SortableCue cue;
  Parser p;
  undefined1 local_40 [4];
  int e;
  VttReader r;
  uint64_t track_num_local;
  Kind param_2_local;
  char *file_local;
  SampleMuxerMetadata *this_local;
  
  r.file_ = (FILE *)track_num;
  libwebvtt::VttReader::VttReader((VttReader *)local_40);
  iVar2 = libwebvtt::VttReader::Open((VttReader *)local_40,file);
  if (iVar2 == 0) {
    libwebvtt::Parser::Parser
              ((Parser *)
               &cue.cue.payload.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size,(Reader *)local_40);
    iVar2 = libwebvtt::Parser::Init
                      ((Parser *)
                       &cue.cue.payload.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size);
    if (iVar2 < 0) {
      printf("Error parsing WebVTT file: \"%s\"\n",file);
      this_local._7_1_ = false;
    }
    else {
      SortableCue::SortableCue((SortableCue *)&t.seconds);
      t._8_8_ = r.file_;
      c = (cue_t *)CONCAT44(c._4_4_,0xffffffff);
      while( true ) {
        iVar2 = libwebvtt::Parser::Parse
                          ((Parser *)
                           &cue.cue.payload.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size,(Cue *)&cue);
        if (iVar2 < 0) break;
        if (0 < iVar2) {
          this_local._7_1_ = true;
          goto LAB_001320a4;
        }
        bVar1 = libwebvtt::Time::operator>=((Time *)&cue.cue.field_0x18,(Time *)&c);
        if (!bVar1) {
          printf("bad WebVTT cue timestamp (out-of-order)\n");
          this_local._7_1_ = false;
          goto LAB_001320a4;
        }
        c = (cue_t *)cue.cue._24_8_;
        bVar1 = libwebvtt::Time::operator<
                          ((Time *)&cue.cue.start_time.seconds,(Time *)&cue.cue.field_0x18);
        if (bVar1) {
          printf("bad WebVTT cue timestamp (stop < start)\n");
          this_local._7_1_ = false;
          goto LAB_001320a4;
        }
        std::
        multiset<SampleMuxerMetadata::SortableCue,_std::less<SampleMuxerMetadata::SortableCue>,_std::allocator<SampleMuxerMetadata::SortableCue>_>
        ::insert(&this->cues_set_,(value_type *)&t.seconds);
      }
      printf("Error parsing WebVTT file: \"%s\"\n",file);
      this_local._7_1_ = false;
LAB_001320a4:
      SortableCue::~SortableCue((SortableCue *)&t.seconds);
    }
    libwebvtt::Parser::~Parser
              ((Parser *)
               &cue.cue.payload.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size);
  }
  else {
    printf("Unable to open WebVTT file: \"%s\"\n",file);
    this_local._7_1_ = false;
  }
  libwebvtt::VttReader::~VttReader((VttReader *)local_40);
  return this_local._7_1_;
}

Assistant:

bool SampleMuxerMetadata::Parse(const char* file, Kind /* kind */,
                                uint64_t track_num) {
  libwebvtt::VttReader r;
  int e = r.Open(file);

  if (e) {
    printf("Unable to open WebVTT file: \"%s\"\n", file);
    return false;
  }

  libwebvtt::Parser p(&r);

  e = p.Init();

  if (e < 0) {  // error
    printf("Error parsing WebVTT file: \"%s\"\n", file);
    return false;
  }

  SortableCue cue;
  cue.track_num = track_num;

  libwebvtt::Time t;
  t.hours = -1;

  for (;;) {
    cue_t& c = cue.cue;
    e = p.Parse(&c);

    if (e < 0) {  // error
      printf("Error parsing WebVTT file: \"%s\"\n", file);
      return false;
    }

    if (e > 0)  // EOF
      return true;

    if (c.start_time >= t) {
      t = c.start_time;
    } else {
      printf("bad WebVTT cue timestamp (out-of-order)\n");
      return false;
    }

    if (c.stop_time < c.start_time) {
      printf("bad WebVTT cue timestamp (stop < start)\n");
      return false;
    }

    cues_set_.insert(cue);
  }
}